

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall Message::Message(Message *this,Message *msg)

{
  Message *msg_local;
  Message *this_local;
  
  std::__cxx11::string::string((string *)&this->o);
  this->c = 0;
  std::__cxx11::string::string((string *)&this->d);
  this->v = 0;
  this->n = 0;
  this->i = 0;
  std::__cxx11::string::string((string *)&this->m);
  this->msg_type = msg->msg_type;
  this->t = msg->t;
  this->c = msg->c;
  std::__cxx11::string::operator=((string *)&this->o,(string *)&msg->o);
  std::__cxx11::string::operator=((string *)&this->d,(string *)&msg->d);
  this->v = msg->v;
  this->n = msg->n;
  return;
}

Assistant:

Message::Message(const Message &msg) {
  msg_type = msg.msg_type;
  t = msg.t;
  c = msg.c;
  o = msg.o;
  d = msg.d;
  v = msg.v;
  n = msg.n;
}